

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token,Value *decoded)

{
  uint uVar1;
  istream *piVar2;
  double value;
  Value local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  String buffer;
  IStringStream is;
  
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&buffer,token->start_,token->end_);
  std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)&buffer,_S_in);
  piVar2 = std::istream::_M_extract<double>((double *)&is);
  uVar1 = *(uint *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18) + 0x20);
  if ((uVar1 & 5) == 0) {
    Value::Value(&local_230,0.0);
    Value::operator=(decoded,&local_230);
    Value::~Value(&local_230);
  }
  else {
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,token->start_,token->end_);
    std::operator+(&local_1e8,"\'",&local_208);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_230,
                   &local_1e8,"\' is not a number.");
    addError(this,(String *)&local_230,token,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::~string((string *)&buffer);
  return (uVar1 & 5) == 0;
}

Assistant:

bool Reader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  String buffer(token.start_, token.end_);
  IStringStream is(buffer);
  if (!(is >> value))
    return addError(
        "'" + String(token.start_, token.end_) + "' is not a number.", token);
  decoded = value;
  return true;
}